

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mark.hpp
# Opt level: O2

Mark * __thiscall bm::Mark::average(Mark *__return_storage_ptr__,Mark *this)

{
  duration<unsigned_long,_std::ratio<1L,_1000000000L>_> local_30;
  _Any_data local_28;
  undefined8 local_18;
  undefined8 uStack_10;
  
  if (this->_iterations == 0) {
    local_18 = 0;
    uStack_10 = 0;
    local_28._M_unused._M_object = (void *)0x0;
    local_28._8_8_ = 0;
    Mark(__return_storage_ptr__,(overflow_callback *)&local_28);
    std::_Function_base::~_Function_base((_Function_base *)&local_28);
  }
  else {
    local_30.__r = (ulong)(this->_total).__r / this->_iterations;
    Mark<unsigned_long,std::ratio<1l,1000000000l>>(__return_storage_ptr__,&local_30);
  }
  return __return_storage_ptr__;
}

Assistant:

Mark average() const
    {
        return (_iterations == 0) ? Mark() : Mark(_total/_iterations);
    }